

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O1

sysbvm_tuple_t sysbvm_wordArray_create(sysbvm_context_t *context,sysbvm_tuple_t slotCount)

{
  sysbvm_tuple_t type;
  sysbvm_tuple_t in_RAX;
  sysbvm_object_tuple_t *psVar1;
  
  if (slotCount == 0) {
    type = (context->roots).wordArrayType;
    if (type != 0) {
      if (*(long *)(type + 0x78) == 0) {
        psVar1 = sysbvm_context_allocateByteTuple(context,type,0);
        *(sysbvm_object_tuple_t **)(type + 0x78) = psVar1;
      }
      in_RAX = *(sysbvm_tuple_t *)(type + 0x78);
    }
    if (type != 0) {
      return in_RAX;
    }
  }
  psVar1 = sysbvm_context_allocateByteTuple(context,(context->roots).wordArrayType,slotCount << 2);
  return (sysbvm_tuple_t)psVar1;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_wordArray_create(sysbvm_context_t *context, sysbvm_tuple_t slotCount)
{
    if(slotCount == 0)
    {
        sysbvm_type_tuple_t *wordArrayTypeObject = (sysbvm_type_tuple_t*)context->roots.wordArrayType;
        if(wordArrayTypeObject)
        {
            if(!wordArrayTypeObject->emptyTrivialSingleton)
                wordArrayTypeObject->emptyTrivialSingleton = (sysbvm_tuple_t)sysbvm_context_allocateByteTuple(context, context->roots.wordArrayType, 0);
            return wordArrayTypeObject->emptyTrivialSingleton;
        }
    }

    return (sysbvm_tuple_t)sysbvm_context_allocateByteTuple(context, context->roots.wordArrayType, slotCount*4);
}